

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_section.hpp
# Opt level: O0

void __thiscall
ELFIO::section_impl<ELFIO::Elf32_Shdr>::set_data
          (section_impl<ELFIO::Elf32_Shdr> *this,char *raw_data,Elf_Xword size)

{
  Elf_Xword __first;
  bool bVar1;
  int iVar2;
  char *pcVar3;
  pointer pcVar4;
  unique_ptr<char[],_std::default_delete<char[]>_> local_28;
  ulong local_20;
  Elf_Xword size_local;
  char *raw_data_local;
  section_impl<ELFIO::Elf32_Shdr> *this_local;
  
  local_20 = size;
  size_local = (Elf_Xword)raw_data;
  raw_data_local = (char *)this;
  iVar2 = (*(this->super_section)._vptr_section[5])();
  if (iVar2 != 8) {
    pcVar3 = (char *)operator_new__(local_20,(nothrow_t *)&std::nothrow);
    std::unique_ptr<char[],std::default_delete<char[]>>::
    unique_ptr<char*,std::default_delete<char[]>,void,bool>
              ((unique_ptr<char[],std::default_delete<char[]>> *)&local_28,pcVar3);
    std::unique_ptr<char[],_std::default_delete<char[]>_>::operator=(&this->data,&local_28);
    std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr(&local_28);
    pcVar4 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get(&this->data);
    __first = size_local;
    if ((pcVar4 == (pointer)0x0) || (size_local == 0)) {
      this->data_size = 0;
    }
    else {
      this->data_size = local_20;
      pcVar3 = (char *)(size_local + local_20);
      pcVar4 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get(&this->data);
      std::copy<char_const*,char*>((char *)__first,pcVar3,pcVar4);
    }
  }
  (*(this->super_section)._vptr_section[0x14])(this,&this->data_size);
  bVar1 = address_translator::empty(this->translator);
  if (bVar1) {
    (*(this->super_section)._vptr_section[0x21])(this,this->data_size);
  }
  return;
}

Assistant:

void set_data( const char* raw_data, Elf_Xword size ) override
    {
        if ( get_type() != SHT_NOBITS ) {
            data = std::unique_ptr<char[]>( new ( std::nothrow ) char[(size_t)size] );
            if ( nullptr != data.get() && nullptr != raw_data ) {
                data_size = size;
                std::copy( raw_data, raw_data + size, data.get() );
            }
            else {
                data_size = 0;
            }
        }

        set_size( data_size );
        if ( translator->empty() ) {
            set_stream_size( (size_t)data_size );
        }
    }